

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

int luaE_resetthread(lua_State *L,int status)

{
  int iVar1;
  StkId pSVar2;
  
  L->ci = &L->base_ci;
  *(undefined1 *)((L->stack).offset + 8) = 0;
  (L->base_ci).func = L->stack;
  (L->base_ci).callstatus = 2;
  iVar1 = 0;
  if (status != 1) {
    iVar1 = status;
  }
  L->status = '\0';
  iVar1 = luaD_closeprotected(L,1,iVar1);
  pSVar2 = (StkId)((L->stack).offset + 0x10);
  if (iVar1 == 0) {
    (L->top).p = pSVar2;
  }
  else {
    luaD_seterrorobj(L,iVar1,pSVar2);
  }
  pSVar2 = (StkId)((L->top).offset + 0x140);
  (L->base_ci).top.p = pSVar2;
  luaD_reallocstack(L,(int)((ulong)((long)pSVar2 - (L->stack).offset) >> 4),0);
  return iVar1;
}

Assistant:

int luaE_resetthread (lua_State *L, int status) {
  CallInfo *ci = L->ci = &L->base_ci;  /* unwind CallInfo list */
  setnilvalue(s2v(L->stack.p));  /* 'function' entry for basic 'ci' */
  ci->func.p = L->stack.p;
  ci->callstatus = CIST_C;
  if (status == LUA_YIELD)
    status = LUA_OK;
  L->status = LUA_OK;  /* so it can run __close metamethods */
  status = luaD_closeprotected(L, 1, status);
  if (status != LUA_OK)  /* errors? */
    luaD_seterrorobj(L, status, L->stack.p + 1);
  else
    L->top.p = L->stack.p + 1;
  ci->top.p = L->top.p + LUA_MINSTACK;
  luaD_reallocstack(L, cast_int(ci->top.p - L->stack.p), 0);
  return status;
}